

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::InvariantOuterEdgeCase::init
          (InvariantOuterEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  pointer *ppPVar2;
  Context *this_00;
  RenderContext *renderCtx;
  pointer pPVar3;
  pointer pPVar4;
  SharedPtrStateBase *pSVar5;
  TestLog *log;
  int iVar6;
  pointer pPVar7;
  pointer pPVar8;
  pointer pPVar9;
  InvariantOuterEdgeCase *pIVar10;
  uint uVar11;
  RenderTarget *renderTarget;
  long *plVar12;
  ShaderProgram *this_01;
  ulong uVar13;
  pointer pPVar14;
  TestError *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ContextInfo *pCVar16;
  size_type *psVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  Context *code;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar19;
  long lVar20;
  size_type *psVar21;
  ulong uVar22;
  undefined1 in_R9B;
  ulong uVar23;
  string fragmentShaderTemplate;
  ScopedLogSection section;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string floatLit01;
  string vertexShaderTemplate;
  undefined1 local_3f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  undefined1 local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  ulong local_3a8;
  size_type *local_3a0;
  value_type local_398;
  Winding local_378;
  bool local_374;
  ShaderProgram *local_370;
  SharedPtrStateBase *local_368;
  size_type *local_360;
  value_type local_358;
  ShaderProgram *local_338;
  SharedPtrStateBase *pSStack_330;
  ulong local_328;
  ulong local_320;
  undefined1 local_318 [32];
  InvariantOuterEdgeCase *local_2f8;
  string local_2f0;
  Context *local_2d0;
  long local_2c8;
  Context local_2c0;
  long local_2a8;
  undefined1 local_2a0 [16];
  ContextInfo *local_290;
  pointer local_288;
  undefined1 local_280 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Base_ptr local_250 [2];
  TestContext *local_240 [2];
  undefined1 local_230 [32];
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [3];
  ios_base local_140 [8];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  deUint32 local_108;
  undefined1 local_100 [208];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x10);
  local_328 = 0;
  uVar19 = extraout_RDX;
  local_2f8 = this;
  do {
    local_320 = 0;
    do {
      psVar21 = &local_398._M_string_length;
      uVar11 = (int)((ulong)((long)(this->m_programs).
                                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_programs).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      local_3a8 = (ulong)uVar11;
      de::floatToString_abi_cxx11_
                ((string *)(local_280 + 0x10),(de *)0x2,10.0 / (float)(int)(uVar11 + 10),(int)uVar19
                );
      local_250[0] = (_Base_ptr)local_240;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_250,
                 "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
                 ,"");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((ostringstream *)local_1b0,(int)local_3a8 + 1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,0x1c889c7);
      local_3f8._0_8_ = &local_3e8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar15) {
        local_3e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_3e8._8_8_ = plVar12[3];
      }
      else {
        local_3e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_3f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar12;
      }
      local_3f8._8_8_ = plVar12[1];
      *plVar12 = (long)paVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append(local_3f8);
      local_2c0.m_contextInfo = (ContextInfo *)local_2a0;
      pCVar16 = (ContextInfo *)(plVar12 + 2);
      if ((ContextInfo *)*plVar12 == pCVar16) {
        local_2a0._0_8_ = pCVar16->_vptr_ContextInfo;
        local_2a0._8_8_ = plVar12[3];
      }
      else {
        local_2a0._0_8_ = pCVar16->_vptr_ContextInfo;
        local_2c0.m_contextInfo = (ContextInfo *)*plVar12;
      }
      local_2a8 = plVar12[1];
      *plVar12 = (long)pCVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._0_8_ != &local_3e8) {
        operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
      }
      if (local_3a0 != psVar21) {
        operator_delete(local_3a0,local_398._M_string_length + 1);
      }
      Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
                ((string *)local_318,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,
                 this->m_spacing,(SpacingMode)local_328,(uint)((int)local_320 != 0),(bool)in_R9B);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)local_318,0,(char *)0x0,0x1c880bf);
      local_360 = &local_358._M_string_length;
      psVar17 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar17) {
        local_358._M_string_length = *psVar17;
        local_358.field_2._M_allocated_capacity = plVar12[3];
      }
      else {
        local_358._M_string_length = *psVar17;
        local_360 = (size_type *)*plVar12;
      }
      local_358._M_dataplus._M_p = (pointer)plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_360);
      local_3d0._0_8_ = &local_3c0;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar15) {
        local_3c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_3c0._8_8_ = plVar12[3];
      }
      else {
        local_3c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_3d0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar12;
      }
      local_3d0._8_8_ = plVar12[1];
      *plVar12 = (long)paVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append(local_3d0,local_280._16_8_);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar17) {
        local_398._M_string_length = *psVar17;
        local_398.field_2._M_allocated_capacity = plVar12[3];
        local_3a0 = psVar21;
      }
      else {
        local_398._M_string_length = *psVar17;
        local_3a0 = (size_type *)*plVar12;
      }
      local_398._M_dataplus._M_p = (pointer)plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3a0);
      local_3f8._0_8_ = &local_3e8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar15) {
        local_3e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_3e8._8_8_ = plVar12[3];
      }
      else {
        local_3e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_3f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar12;
      }
      local_3f8._8_8_ = plVar12[1];
      *plVar12 = (long)paVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append(local_3f8,local_280._16_8_);
      local_1b0 = (undefined1  [8])local_1a0;
      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar12 + 2);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12 == pbVar18)
      {
        local_1a0[0]._M_dataplus._M_p = (pbVar18->_M_dataplus)._M_p;
        local_1a0[0]._M_string_length = plVar12[3];
      }
      else {
        local_1a0[0]._M_dataplus._M_p = (pbVar18->_M_dataplus)._M_p;
        local_1b0 = (undefined1  [8])*plVar12;
      }
      local_1a8 = (undefined1  [8])plVar12[1];
      *plVar12 = (long)pbVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)local_1b0);
      local_2d0 = &local_2c0;
      code = (Context *)(plVar12 + 2);
      if ((Context *)*plVar12 == code) {
        local_2c0.m_testCtx = code->m_testCtx;
        local_2c0.m_renderCtx = (RenderContext *)plVar12[3];
      }
      else {
        local_2c0.m_testCtx = code->m_testCtx;
        local_2d0 = (Context *)*plVar12;
      }
      local_2c8 = plVar12[1];
      *plVar12 = (long)code;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,(ulong)(local_1a0[0]._M_dataplus._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._0_8_ != &local_3e8) {
        operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
      }
      if (local_3a0 != psVar21) {
        operator_delete(local_3a0,local_398._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._0_8_ != &local_3c0) {
        operator_delete((void *)local_3d0._0_8_,local_3c0._M_allocated_capacity + 1);
      }
      if (local_360 != &local_358._M_string_length) {
        operator_delete(local_360,local_358._M_string_length + 1);
      }
      pIVar10 = local_2f8;
      if ((Context *)local_318._0_8_ != (Context *)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
      }
      local_318._0_8_ = local_318 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_318,
                 "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
                 ,"");
      this_01 = (ShaderProgram *)operator_new(0xd0);
      this_00 = (pIVar10->super_TestCase).m_context;
      renderCtx = this_00->m_renderCtx;
      local_100[0x10] = 0;
      local_100._17_8_ = 0;
      local_100._0_8_ = (pointer)0x0;
      local_100[8] = 0;
      local_100._9_7_ = 0;
      memset((ostringstream *)local_1b0,0,0xac);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2f0,(_anonymous_namespace_ *)this_00,(Context *)local_250[0],(char *)code);
      local_3f8._0_8_ = local_3f8._0_8_ & 0xffffffff00000000;
      local_3f8._8_8_ = local_3e8._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_3f8 + 8),local_2f0._M_dataplus._M_p,
                 local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + (local_3f8._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_3f8 + 8));
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_1d0,(_anonymous_namespace_ *)(pIVar10->super_TestCase).m_context,
                 (Context *)local_2c0.m_contextInfo,(char *)code);
      local_3a0 = (size_type *)CONCAT44(local_3a0._4_4_,3);
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_398,local_1d0._M_dataplus._M_p,
                 local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_3a0 & 0xffffffff) * 0x18),&local_398);
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_1f0,(_anonymous_namespace_ *)(pIVar10->super_TestCase).m_context,local_2d0,
                 (char *)code);
      local_3d0._0_4_ = 4;
      local_3d0._8_8_ = local_3c0._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_3d0 + 8),local_1f0._M_dataplus._M_p,
                 local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + (local_3d0._0_8_ & 0xffffffff) * 0x18),
                  (value_type *)(local_3d0 + 8));
      Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_210,(_anonymous_namespace_ *)(pIVar10->super_TestCase).m_context,
                 (Context *)local_318._0_8_,(char *)code);
      local_360 = (size_type *)CONCAT44(local_360._4_4_,1);
      local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_358,local_210._M_dataplus._M_p,
                 local_210._M_dataplus._M_p + local_210._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + ((ulong)local_360 & 0xffffffff) * 0x18),&local_358);
      local_290 = (ContextInfo *)local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"out_te_tessCoord","");
      local_230._0_8_ = local_230 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,local_290,
                 (undefined1 *)((long)&(local_288->_M_dataplus)._M_p + (long)local_290));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_100,(value_type *)local_230);
      local_108 = 0x8c8c;
      glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)local_1b0);
      pSStack_330 = (SharedPtrStateBase *)0x0;
      local_338 = this_01;
      local_368 = (SharedPtrStateBase *)operator_new(0x20);
      local_368->strongRefCount = 0;
      local_368->weakRefCount = 0;
      local_368->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0217e258;
      local_368[1]._vptr_SharedPtrStateBase = (_func_int **)this_01;
      local_368->strongRefCount = 1;
      local_368->weakRefCount = 1;
      local_378 = (Winding)local_328;
      local_374 = SUB81(local_320,0);
      LOCK();
      local_368->strongRefCount = local_368->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_368->weakRefCount = local_368->weakRefCount + 1;
      UNLOCK();
      pPVar3 = (pIVar10->m_programs).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_370 = this_01;
      pSStack_330 = local_368;
      if (pPVar3 == (pIVar10->m_programs).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pPVar4 = (pIVar10->m_programs).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pPVar3 - (long)pPVar4 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        lVar20 = (long)pPVar3 - (long)pPVar4 >> 3;
        uVar22 = lVar20 * -0x5555555555555555;
        uVar13 = uVar22;
        if (pPVar3 == pPVar4) {
          uVar13 = 1;
        }
        uVar23 = uVar13 + uVar22;
        if (0x555555555555554 < uVar23) {
          uVar23 = 0x555555555555555;
        }
        if (CARRY8(uVar13,uVar22)) {
          uVar23 = 0x555555555555555;
        }
        if (uVar23 == 0) {
          pPVar14 = (pointer)0x0;
        }
        else {
          pPVar14 = (pointer)operator_new(uVar23 * 0x18);
        }
        (&pPVar14->usePointMode)[lVar20 * 8] = local_374;
        (&pPVar14->winding)[lVar20 * 2] = local_378;
        (&(pPVar14->program).m_ptr)[lVar20] = local_370;
        (&(pPVar14->program).m_state)[lVar20] = local_368;
        pPVar7 = pPVar4;
        pPVar8 = pPVar14;
        if (local_368 != (SharedPtrStateBase *)0x0) {
          LOCK();
          local_368->strongRefCount = local_368->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &(&(pPVar14->program).m_state)[lVar20]->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        for (; pPVar9 = pPVar4, pIVar10 = local_2f8, pPVar3 != pPVar7; pPVar7 = pPVar7 + 1) {
          pPVar8->usePointMode = pPVar7->usePointMode;
          pPVar8->winding = pPVar7->winding;
          (pPVar8->program).m_ptr = (pPVar7->program).m_ptr;
          pSVar5 = (pPVar7->program).m_state;
          (pPVar8->program).m_state = pSVar5;
          if (pSVar5 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
            UNLOCK();
            LOCK();
            pdVar1 = &((pPVar8->program).m_state)->weakRefCount;
            *pdVar1 = *pdVar1 + 1;
            UNLOCK();
          }
          pPVar8 = pPVar8 + 1;
        }
        for (; local_2f8 = pIVar10, pPVar3 != pPVar9; pPVar9 = pPVar9 + 1) {
          pSVar5 = (pPVar9->program).m_state;
          if (pSVar5 != (SharedPtrStateBase *)0x0) {
            LOCK();
            pdVar1 = &pSVar5->strongRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              (pPVar9->program).m_ptr = (ShaderProgram *)0x0;
              (*((pPVar9->program).m_state)->_vptr_SharedPtrStateBase[2])();
            }
            LOCK();
            pdVar1 = &((pPVar9->program).m_state)->weakRefCount;
            *pdVar1 = *pdVar1 + -1;
            UNLOCK();
            if (*pdVar1 == 0) {
              pSVar5 = (pPVar9->program).m_state;
              if (pSVar5 != (SharedPtrStateBase *)0x0) {
                (*pSVar5->_vptr_SharedPtrStateBase[1])();
              }
              (pPVar9->program).m_state = (SharedPtrStateBase *)0x0;
            }
          }
          pIVar10 = local_2f8;
        }
        if (pPVar4 != (pointer)0x0) {
          operator_delete(pPVar4,(long)(pIVar10->m_programs).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pPVar4);
        }
        (pIVar10->m_programs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
        ._M_impl.super__Vector_impl_data._M_start = pPVar14;
        (pIVar10->m_programs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
        ._M_impl.super__Vector_impl_data._M_finish = pPVar8 + 1;
        (pIVar10->m_programs).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar14 + uVar23;
      }
      else {
        pPVar3->usePointMode = local_374;
        pPVar3->winding = local_378;
        (pPVar3->program).m_ptr = this_01;
        (pPVar3->program).m_state = local_368;
        if (local_368 != (SharedPtrStateBase *)0x0) {
          LOCK();
          local_368->strongRefCount = local_368->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pPVar3->program).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        ppPVar2 = &(pIVar10->m_programs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar2 = *ppPVar2 + 1;
      }
      if (local_368 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &local_368->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_370 = (ShaderProgram *)0x0;
          (*local_368->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &local_368->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_368 != (SharedPtrStateBase *)0x0) {
            (*local_368->_vptr_SharedPtrStateBase[1])();
          }
          local_368 = (SharedPtrStateBase *)0x0;
        }
      }
      if (pSStack_330 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSStack_330->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_338 = (ShaderProgram *)0x0;
          (*pSStack_330->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &pSStack_330->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (pSStack_330 != (SharedPtrStateBase *)0x0) {
            (*pSStack_330->_vptr_SharedPtrStateBase[1])();
          }
          pSStack_330 = (SharedPtrStateBase *)0x0;
        }
      }
      if ((ContextInfo *)local_230._0_8_ != (ContextInfo *)(local_230 + 0x10)) {
        operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
      }
      if (local_290 != (ContextInfo *)local_280) {
        operator_delete(local_290,(ulong)((long)&((_Alloc_hider *)local_280._0_8_)->_M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_3d0._8_8_ != local_3c0._M_local_buf + 8) {
        operator_delete((void *)local_3d0._8_8_,local_3c0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_3f8._8_8_ != local_3e8._M_local_buf + 8) {
        operator_delete((void *)local_3f8._8_8_,local_3e8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_120);
      lVar20 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + lVar20));
        this = local_2f8;
        lVar20 = lVar20 + -0x18;
      } while (lVar20 != -0x18);
      log = ((local_2f8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((MessageBuilder *)local_1b0,(int)local_3a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_3a0,0,(char *)0x0,0x1ca3fde);
      local_3f8._0_8_ = &local_3e8;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar15) {
        local_3e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_3e8._8_8_ = plVar12[3];
      }
      else {
        local_3e8._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_3f8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar12;
      }
      local_3f8._8_8_ = plVar12[1];
      *plVar12 = (long)paVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::ostream::operator<<((MessageBuilder *)local_1b0,(int)local_3a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_360,0,(char *)0x0,0x1b31c60);
      local_3d0._0_8_ = &local_3c0;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar15) {
        local_3c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_3c0._8_8_ = plVar12[3];
      }
      else {
        local_3c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_3d0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar12;
      }
      local_3d0._8_8_ = plVar12[1];
      *plVar12 = (long)paVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_2f0,log,(string *)local_3f8,(string *)local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._0_8_ != &local_3c0) {
        operator_delete((void *)local_3d0._0_8_,local_3c0._M_allocated_capacity + 1);
      }
      if (local_360 != &local_358._M_string_length) {
        operator_delete(local_360,local_358._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._0_8_ != &local_3e8) {
        operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
      }
      if (local_3a0 != &local_398._M_string_length) {
        operator_delete(local_3a0,local_398._M_string_length + 1);
      }
      if (((int)local_3a8 == 0) ||
         ((((this->m_programs).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr)->m_program).m_info.linkOk
          == false)) {
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        (this->m_programs).
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr);
      }
      if ((((this->m_programs).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].program.m_ptr)->m_program).m_info.linkOk
          == false) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"Program compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0xfa4);
        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (0 < (int)local_3a8) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Note: program ",0xe);
        std::ostream::operator<<((ostringstream *)local_1a8,(int)local_3a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   " is similar to above, except some constants are different, and: ",0x40);
        Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program::description_abi_cxx11_
                  ((string *)local_3f8,
                   (this->m_programs).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InvariantOuterEdgeCase::Program>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_3f8._0_8_,local_3f8._8_8_);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._0_8_ != &local_3e8) {
          operator_delete((void *)local_3f8._0_8_,local_3e8._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      tcu::TestLog::endSection((TestLog *)local_2f0._M_dataplus._M_p);
      uVar19 = extraout_RDX_00;
      if ((Context *)local_318._0_8_ != (Context *)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
        uVar19 = extraout_RDX_01;
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,(ulong)((long)&(local_2c0.m_testCtx)->m_platform + 1));
        uVar19 = extraout_RDX_02;
      }
      if (local_2c0.m_contextInfo != (ContextInfo *)local_2a0) {
        operator_delete(local_2c0.m_contextInfo,(ulong)((long)(Platform **)local_2a0._0_8_ + 1));
        uVar19 = extraout_RDX_03;
      }
      if (local_250[0] != (_Base_ptr)local_240) {
        operator_delete(local_250[0],(ulong)((long)&local_240[0]->m_platform + 1));
        uVar19 = extraout_RDX_04;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._16_8_ != &local_260) {
        operator_delete((void *)local_280._16_8_,(ulong)(local_260._M_allocated_capacity + 1));
        uVar19 = extraout_RDX_05;
      }
      iVar6 = (int)local_320;
      local_320 = (ulong)(iVar6 + 1);
    } while (iVar6 == 0);
    iVar6 = (int)local_328;
    uVar11 = iVar6 + 1;
    local_328 = (ulong)uVar11;
    if (iVar6 != 0) {
      return uVar11;
    }
  } while( true );
}

Assistant:

void InvariantOuterEdgeCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	for (int windingI = 0; windingI < WINDING_LAST; windingI++)
	{
		const Winding winding = (Winding)windingI;

		for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
		{
			const bool		usePointMode	= usePointModeI != 0;
			const int		programNdx		= (int)m_programs.size();
			const string	floatLit01		= de::floatToString(10.0f / (float)(programNdx + 10), 2);

			std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
														 "\n"
														 "in highp float in_v_attr;\n"
														 "out highp float in_tc_attr;\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	in_tc_attr = in_v_attr;\n"
														 "}\n");
			std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
														 "\n"
														 "layout (vertices = " + de::toString(programNdx+1) + ") out;\n"
														 "\n"
														 "in highp float in_tc_attr[];\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	gl_TessLevelInner[0] = in_tc_attr[0];\n"
														 "	gl_TessLevelInner[1] = in_tc_attr[1];\n"
														 "\n"
														 "	gl_TessLevelOuter[0] = in_tc_attr[2];\n"
														 "	gl_TessLevelOuter[1] = in_tc_attr[3];\n"
														 "	gl_TessLevelOuter[2] = in_tc_attr[4];\n"
														 "	gl_TessLevelOuter[3] = in_tc_attr[5];\n"
														 "}\n");
			std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
														 "${TESSELLATION_SHADER_REQUIRE}\n"
														 "\n"
														 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing, winding, usePointMode) +
														 "\n"
														 "out highp vec4 in_f_color;\n"
														 "invariant out highp vec3 out_te_tessCoord;\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	gl_Position = vec4(gl_TessCoord.xy*" + floatLit01 + " - float(gl_PrimitiveID)*0.05, 0.0, 1.0);\n"
														 "	in_f_color = vec4(" + floatLit01 + ");\n"
														 "	out_te_tessCoord = gl_TessCoord;\n"
														 "}\n");
			std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
														 "\n"
														 "layout (location = 0) out mediump vec4 o_color;\n"
														 "\n"
														 "in highp vec4 in_f_color;\n"
														 "\n"
														 "void main (void)\n"
														 "{\n"
														 "	o_color = in_f_color;\n"
														 "}\n");

			m_programs.push_back(Program(winding, usePointMode,
										 SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
				<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
				<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
				<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
				<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))
				<< glu::TransformFeedbackVarying		("out_te_tessCoord")
				<< glu::TransformFeedbackMode			(GL_INTERLEAVED_ATTRIBS)))));

			{
				const tcu::ScopedLogSection section(m_testCtx.getLog(), "Program" + de::toString(programNdx), "Program " + de::toString(programNdx));

				if (programNdx == 0 || !m_programs.back().program->isOk())
					m_testCtx.getLog() << *m_programs.back().program;

				if (!m_programs.back().program->isOk())
					TCU_FAIL("Program compilation failed");

				if (programNdx > 0)
					m_testCtx.getLog() << TestLog::Message << "Note: program " << programNdx << " is similar to above, except some constants are different, and: " << m_programs.back().description() << TestLog::EndMessage;
			}
		}
	}
}